

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O1

void mbedtls_entropy_free(mbedtls_entropy_context *ctx)

{
  if (ctx->accumulator_started != -1) {
    mbedtls_md_free(&ctx->accumulator);
    ctx->source_count = 0;
    mbedtls_platform_zeroize(ctx->source,0x28);
    ctx->accumulator_started = -1;
  }
  return;
}

Assistant:

void mbedtls_entropy_free(mbedtls_entropy_context *ctx)
{
    /* If the context was already free, don't call free() again.
     * This is important for mutexes which don't allow double-free. */
    if (ctx->accumulator_started == -1) {
        return;
    }

#if defined(MBEDTLS_THREADING_C)
    mbedtls_mutex_free(&ctx->mutex);
#endif
    mbedtls_md_free(&ctx->accumulator);
#if defined(MBEDTLS_ENTROPY_NV_SEED)
    ctx->initial_entropy_run = 0;
#endif
    ctx->source_count = 0;
    mbedtls_platform_zeroize(ctx->source, sizeof(ctx->source));
    ctx->accumulator_started = -1;
}